

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ushort *puVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  U32 u_1;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar13;
  ulong uVar14;
  FSE_CTable FVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar12;
  
  uVar11 = 1 << ((byte)tableLog & 0x1f);
  uVar12 = (ulong)uVar11;
  uVar6 = 1;
  if (tableLog != 0) {
    uVar6 = (ulong)(uVar11 >> 1);
  }
  if (((ulong)workSpace & 1) != 0) {
    __assert_fail("((size_t)workSpace & 1) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3809,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  uVar16 = (ulong)(maxSymbolValue + 2);
  if (wkspSize < ((1L << ((byte)tableLog & 0x3f)) + uVar16 & 0xfffffffffffffffe) * 2 + 8) {
    sVar8 = 0xffffffffffffffd4;
  }
  else {
    *(short *)ct = (short)tableLog;
    *(short *)((long)ct + 2) = (short)maxSymbolValue;
    if (0xf < tableLog) {
      __assert_fail("tableLog < 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x380e,
                    "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                   );
    }
    uVar13 = uVar11 - 1;
    iVar18 = (uVar11 >> 1) + (uVar11 >> 3) + 3;
    *(undefined2 *)workSpace = 0;
    uVar22 = maxSymbolValue + 1;
    uVar20 = uVar13;
    uVar9 = 0;
    while (uVar5 = uVar9 + 1, uVar5 <= uVar22) {
      uVar14 = (ulong)uVar9;
      uVar10 = normalizedCounter[uVar14];
      if (uVar10 == 0xffff) {
        *(short *)((long)workSpace + (ulong)uVar5 * 2) =
             *(short *)((long)workSpace + uVar14 * 2) + 1;
        uVar14 = (ulong)uVar20;
        uVar20 = uVar20 - 1;
        *(char *)((long)workSpace + uVar14 + uVar16 * 2) = (char)uVar9;
        uVar9 = uVar5;
      }
      else {
        if ((short)uVar10 < 0) {
          __assert_fail("normalizedCounter[u-1] >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x381f,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        puVar1 = (ushort *)((long)workSpace + uVar14 * 2);
        uVar2 = *puVar1;
        *(ushort *)((long)workSpace + (ulong)uVar5 * 2) = uVar10 + *puVar1;
        uVar9 = uVar5;
        if (CARRY2(uVar10,uVar2)) {
          __assert_fail("cumul[u] >= cumul[u-1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3821,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
      }
    }
    *(short *)((long)workSpace + (ulong)uVar22 * 2) = (short)uVar11 + 1;
    if (uVar20 == uVar13) {
      lVar21 = (long)workSpace + uVar12 + uVar16 * 2;
      lVar17 = 0;
      lVar19 = 0;
      for (uVar20 = 0; uVar20 != uVar22; uVar20 = uVar20 + 1) {
        sVar3 = normalizedCounter[uVar20];
        *(long *)(lVar21 + lVar19) = lVar17;
        for (lVar7 = 8; lVar7 < sVar3; lVar7 = lVar7 + 8) {
          *(long *)(lVar21 + lVar19 + lVar7) = lVar17;
        }
        if (sVar3 < 0) {
          __assert_fail("n>=0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3837,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        lVar19 = lVar19 + sVar3;
        lVar17 = lVar17 + 0x101010101010101;
      }
      if ((uVar11 & 1) != 0) {
        __assert_fail("tableSize % unroll == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3842,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
      uVar20 = 0;
      for (uVar14 = 0; uVar14 < uVar12; uVar14 = uVar14 + 2) {
        uVar9 = uVar20;
        for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
          *(undefined1 *)((long)workSpace + (ulong)(uVar9 & uVar13) + uVar16 * 2) =
               *(undefined1 *)(lVar21 + lVar17);
          uVar9 = uVar9 + iVar18;
        }
        uVar20 = uVar20 + iVar18 * 2 & uVar13;
        lVar21 = lVar21 + 2;
      }
      if (uVar20 != 0) {
        __assert_fail("position == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x384b,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
    }
    else {
      uVar14 = 0;
      for (uVar23 = 0; uVar23 != uVar22; uVar23 = uVar23 + 1) {
        uVar10 = normalizedCounter[uVar23];
        uVar9 = 0;
        if ((short)uVar10 < 1) {
          uVar10 = 0;
        }
        for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
          *(char *)((long)workSpace + uVar14 + uVar16 * 2) = (char)uVar23;
          do {
            uVar5 = (int)uVar14 + iVar18 & uVar13;
            uVar14 = (ulong)uVar5;
          } while (uVar20 < uVar5);
        }
      }
      if ((int)uVar14 != 0) {
        __assert_fail("position==0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3859,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
    }
    for (uVar14 = 0; uVar12 != uVar14; uVar14 = uVar14 + 1) {
      uVar23 = (ulong)*(byte *)((long)workSpace + uVar14 + uVar16 * 2);
      uVar10 = *(ushort *)((long)workSpace + uVar23 * 2);
      *(ushort *)((long)workSpace + uVar23 * 2) = uVar10 + 1;
      *(short *)((long)ct + (ulong)uVar10 * 2 + 4) = (short)uVar11 + (short)uVar14;
    }
    FVar15 = tableLog * 0x10000 - uVar11;
    sVar8 = 0;
    iVar18 = 0;
    for (uVar11 = 0; uVar11 <= maxSymbolValue; uVar11 = uVar11 + 1) {
      uVar12 = (ulong)uVar11;
      uVar10 = normalizedCounter[uVar12];
      if ((uVar10 == 0xffff) || (uVar10 == 1)) {
        ct[uVar6 + uVar12 * 2 + 2] = FVar15;
        if (iVar18 < 0) {
          __assert_fail("total <= INT_MAX",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x3870,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        ct[uVar6 + uVar12 * 2 + 1] = iVar18 - 1;
        iVar18 = iVar18 + 1;
      }
      else {
        uVar20 = (uint)uVar10;
        if (uVar20 == 0) {
          ct[uVar6 + uVar12 * 2 + 2] = FVar15 + 0x10000;
        }
        else {
          if ((short)uVar10 < 2) {
            __assert_fail("normalizedCounter[s] > 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x3875,
                          "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                         );
          }
          uVar9 = uVar10 - 1 & 0xffff;
          iVar4 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          ct[uVar6 + uVar12 * 2 + 2] =
               (tableLog - iVar4) * 0x10000 - (uVar20 << ((byte)(tableLog - iVar4) & 0x1f));
          ct[uVar6 + uVar12 * 2 + 1] = iVar18 - uVar20;
          iVar18 = iVar18 + (uint)uVar10;
        }
      }
    }
  }
  return sVar8;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}